

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O2

void __thiscall dtc::fdt::checking::check_manager::check_manager(check_manager *this)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>_>
  *this_00;
  _Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_true>
  *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer p_Var3;
  ulong *puVar4;
  size_t sVar5;
  __node_ptr p_Var6;
  ulong uVar7;
  allocator<char> local_91;
  string local_90;
  undefined8 *local_70;
  anon_struct_8_0_00000001_for___align local_68;
  size_type local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  _Scoped_node local_48;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_38;
  
  (this->checkers)._M_h._M_buckets = &(this->checkers)._M_h._M_single_bucket;
  (this->checkers)._M_h._M_bucket_count = 1;
  (this->checkers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->checkers)._M_h._M_element_count = 0;
  (this->checkers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->checkers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->checkers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &this->disabled_checkers;
  (this->disabled_checkers)._M_h._M_buckets = &(this->disabled_checkers)._M_h._M_single_bucket;
  (this->disabled_checkers)._M_h._M_bucket_count = 1;
  (this->disabled_checkers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->disabled_checkers)._M_h._M_element_count = 0;
  (this->disabled_checkers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->disabled_checkers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->disabled_checkers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_38 = &this_00->_M_h;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"compatible",(allocator<char> *)&local_68);
  add_property_type_checker<(dtc::fdt::property_value::value_type)0>
            (this,"type-compatible",&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"model",(allocator<char> *)&local_68);
  add_property_type_checker<(dtc::fdt::property_value::value_type)1>(this,"type-model",&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"phandle",(allocator<char> *)&local_68);
  add_property_size_checker(this,"type-phandle",&local_90,4);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"cells-attributes",&local_91);
  local_70 = (undefined8 *)operator_new(0x28);
  local_90._M_string_length = local_60;
  local_70[1] = 0;
  local_70[2] = 0;
  local_70[3] = 0;
  local_70[4] = "cells-attributes";
  *local_70 = &PTR__checker_0014ef80;
  paVar2 = &local_90.field_2;
  if (local_68 == (anon_struct_8_0_00000001_for___align)&local_58) {
    local_90.field_2._8_8_ = uStack_50;
    local_90._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_90._M_dataplus._M_p = (pointer)local_68;
  }
  local_90.field_2._M_allocated_capacity._1_7_ = uStack_57;
  local_90.field_2._M_local_buf[0] = local_58;
  local_60 = 0;
  local_58 = 0;
  local_68 = (anon_struct_8_0_00000001_for___align)&local_58;
  local_48._M_h = (__hashtable_alloc *)this_00;
  p_Var3 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_true>_>_>
           ::allocate((allocator_type *)this_00,1);
  (p_Var3->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &p_Var3->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_true>
  ;
  puVar4 = (ulong *)((long)&(p_Var3->
                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>
                            ._M_storage._M_storage + 0x10);
  *(ulong **)
   &(p_Var3->
    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_true>
    ).
    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>
    ._M_storage._M_storage = puVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar2) {
    *puVar4 = local_90.field_2._M_allocated_capacity;
    *(undefined8 *)
     ((long)&(p_Var3->
             super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_true>
             ).
             super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>
             ._M_storage._M_storage + 0x18) = local_90.field_2._8_8_;
  }
  else {
    (p_Var1->
    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>
    )._M_storage._M_storage.__align =
         (anon_struct_8_0_00000001_for___align)local_90._M_dataplus._M_p;
    *puVar4 = local_90.field_2._M_allocated_capacity;
  }
  *(size_type *)
   ((long)&(p_Var3->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>
           ._M_storage._M_storage + 8) = local_90._M_string_length;
  local_90._M_string_length = 0;
  local_90.field_2._M_allocated_capacity =
       local_90.field_2._M_allocated_capacity & 0xffffffffffffff00;
  *(undefined8 **)
   ((long)&(p_Var3->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>
           ._M_storage._M_storage + 0x20) = local_70;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  local_48._M_node = p_Var3;
  sVar5 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00,(string *)p_Var1);
  uVar7 = sVar5 % (this->disabled_checkers)._M_h._M_bucket_count;
  p_Var6 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(&this_00->_M_h,uVar7,(key_type *)p_Var1,sVar5);
  if (p_Var6 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(local_38,uVar7,sVar5,p_Var3,1);
    local_48._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"deleted-nodes",&local_91);
  local_70 = (undefined8 *)operator_new(0x28);
  local_90._M_string_length = local_60;
  local_70[3] = 0;
  local_70[1] = 0;
  local_70[2] = 0;
  local_70[4] = "deleted-nodes";
  *local_70 = &PTR__checker_0014efc8;
  if (local_68 == (anon_struct_8_0_00000001_for___align)&local_58) {
    local_90.field_2._8_8_ = uStack_50;
    local_90._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_90._M_dataplus._M_p = (pointer)local_68;
  }
  local_90.field_2._M_allocated_capacity._1_7_ = uStack_57;
  local_90.field_2._M_local_buf[0] = local_58;
  local_60 = 0;
  local_58 = 0;
  local_68 = (anon_struct_8_0_00000001_for___align)&local_58;
  local_48._M_h = (__hashtable_alloc *)this;
  p_Var3 = std::
           allocator_traits<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_true>_>_>
           ::allocate((allocator_type *)this,1);
  (p_Var3->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  p_Var1 = &p_Var3->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_true>
  ;
  puVar4 = (ulong *)((long)&(p_Var3->
                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>
                            ._M_storage._M_storage + 0x10);
  *(ulong **)
   &(p_Var3->
    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_true>
    ).
    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>
    ._M_storage._M_storage = puVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar2) {
    *puVar4 = local_90.field_2._M_allocated_capacity;
    *(undefined8 *)
     ((long)&(p_Var3->
             super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_true>
             ).
             super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>
             ._M_storage._M_storage + 0x18) = local_90.field_2._8_8_;
  }
  else {
    (p_Var1->
    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>
    )._M_storage._M_storage.__align =
         (anon_struct_8_0_00000001_for___align)local_90._M_dataplus._M_p;
    *puVar4 = local_90.field_2._M_allocated_capacity;
  }
  *(size_type *)
   ((long)&(p_Var3->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>
           ._M_storage._M_storage + 8) = local_90._M_string_length;
  local_90._M_string_length = 0;
  local_90.field_2._M_allocated_capacity =
       local_90.field_2._M_allocated_capacity & 0xffffffffffffff00;
  *(undefined8 **)
   ((long)&(p_Var3->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>
           ._M_storage._M_storage + 0x20) = local_70;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  local_48._M_node = p_Var3;
  sVar5 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this,(string *)p_Var1);
  uVar7 = sVar5 % (this->checkers)._M_h._M_bucket_count;
  p_Var6 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)this,uVar7,(key_type *)p_Var1,sVar5);
  if (p_Var6 == (__node_ptr)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node
              ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)this,uVar7,sVar5,p_Var3,1);
    local_48._M_node = (pointer)0x0;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::checker_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_48);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

check_manager::check_manager()
{
	// NOTE: All checks listed here MUST have a corresponding line
	// in the man page!
	add_property_type_checker<property_value::STRING_LIST>(
			"type-compatible", string("compatible"));
	add_property_type_checker<property_value::STRING>(
			"type-model", string("model"));
	add_property_size_checker("type-phandle", string("phandle"), 4);
	disabled_checkers.insert(std::make_pair(string("cells-attributes"),
		new address_cells_checker("cells-attributes")));
	checkers.insert(std::make_pair(string("deleted-nodes"),
		new deleted_node_checker("deleted-nodes")));
}